

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void benchmark_test(void)

{
  uint uVar1;
  rpc_server server;
  string local_3f0;
  rpc_server local_3d0;
  
  uVar1 = std::thread::hardware_concurrency();
  rest_rpc::rpc_service::rpc_server::rpc_server(&local_3d0,9000,(ulong)uVar1,0xf,10);
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"echo","");
  rest_rpc::rpc_service::router::
  register_handler<false,std::__cxx11::string(*)(std::weak_ptr<rest_rpc::rpc_service::connection>,std::__cxx11::string_const&)>
            (&local_3d0.router_,&local_3f0,echo,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  rest_rpc::rpc_service::io_service_pool::run(&local_3d0.io_service_pool_);
  rest_rpc::rpc_service::rpc_server::~rpc_server(&local_3d0);
  return;
}

Assistant:

void benchmark_test() {
  rpc_server server(9000, std::thread::hardware_concurrency());
  server.register_handler("echo", echo);
  server.run();
}